

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O3

int64_t npas4::GetRAMVirtualAvailable(void)

{
  long lVar1;
  sysinfo memInfo;
  sysinfo local_80;
  
  sysinfo(&local_80);
  lVar1 = local_80.mem_unit * local_80.totalswap;
  sysinfo(&local_80);
  return (ulong)local_80.mem_unit * (local_80.freeswap - local_80.totalswap) + lVar1;
}

Assistant:

int64_t npas4::GetRAMVirtualAvailable()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return memInfo.ullTotalPageFile;
#else
	return npas4::GetRAMVirtualTotal() - npas4::GetRAMVirtualUsed();
#endif
}